

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int asciiToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint c;
  uchar *inend;
  uchar *outend;
  uchar *processed;
  uchar *base;
  uchar *outstart;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  iVar1 = *outlen;
  iVar2 = *inlen;
  inlen_local = (int *)in;
  outlen_local = (int *)out;
  while( true ) {
    bVar3 = false;
    if (inlen_local < in + iVar2) {
      bVar3 = (long)outlen_local + (5 - (long)out) < (long)*outlen;
    }
    if (!bVar3) break;
    if (out + iVar1 <= outlen_local) break;
    if (0x7f < (byte)*inlen_local) {
      *outlen = (int)outlen_local - (int)out;
      *inlen = (int)inlen_local - (int)in;
      return -1;
    }
    *(byte *)outlen_local = (byte)*inlen_local;
    inlen_local = (int *)((long)inlen_local + 1);
    outlen_local = (int *)((long)outlen_local + 1);
  }
  *outlen = (int)outlen_local - (int)out;
  *inlen = (int)inlen_local - (int)in;
  return *outlen;
}

Assistant:

static int
asciiToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    const unsigned char* processed = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    unsigned int c;

    inend = in + (*inlen);
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
	c= *in++;

        if (out >= outend)
	    break;
        if (c < 0x80) {
	    *out++ = c;
	} else {
	    *outlen = out - outstart;
	    *inlen = processed - base;
	    return(-1);
	}

	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlen = processed - base;
    return(*outlen);
}